

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O2

void blake2b_mix(uint64_t *v,int a,int b,int c,int d,uint64_t x,uint64_t y)

{
  ulong uVar1;
  
  uVar1 = x + v[(uint)a] + v[(uint)b];
  v[(uint)a] = uVar1;
  uVar1 = uVar1 ^ v[(uint)d];
  uVar1 = uVar1 << 0x20 | uVar1 >> 0x20;
  v[(uint)d] = uVar1;
  uVar1 = uVar1 + v[(uint)c];
  v[(uint)c] = uVar1;
  uVar1 = uVar1 ^ v[(uint)b];
  uVar1 = uVar1 << 0x28 | uVar1 >> 0x18;
  v[(uint)b] = uVar1;
  uVar1 = uVar1 + y + v[(uint)a];
  v[(uint)a] = uVar1;
  uVar1 = uVar1 ^ v[(uint)d];
  uVar1 = uVar1 << 0x30 | uVar1 >> 0x10;
  v[(uint)d] = uVar1;
  uVar1 = uVar1 + v[(uint)c];
  v[(uint)c] = uVar1;
  uVar1 = uVar1 ^ v[(uint)b];
  v[(uint)b] = uVar1 << 1 | (ulong)((long)uVar1 < 0);
  return;
}

Assistant:

static void blake2b_mix(uint64_t v[16], int a, int b, int c, int d, uint64_t x,
                        uint64_t y) {
  v[a] = v[a] + v[b] + x;
  v[d] = CRYPTO_rotr_u64(v[d] ^ v[a], 32);
  v[c] = v[c] + v[d];
  v[b] = CRYPTO_rotr_u64(v[b] ^ v[c], 24);
  v[a] = v[a] + v[b] + y;
  v[d] = CRYPTO_rotr_u64(v[d] ^ v[a], 16);
  v[c] = v[c] + v[d];
  v[b] = CRYPTO_rotr_u64(v[b] ^ v[c], 63);
}